

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O0

TrackData * GenerateKBI19Track(TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track)

{
  initializer_list<unsigned_char> iVar1;
  Track *pTVar2;
  bool bVar3;
  int iVar4;
  Data *pDVar5;
  BitBuffer *bitstream;
  allocator<unsigned_char> local_1c9;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1c8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1c0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1b8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1b0;
  Data local_1a8;
  allocator<unsigned_char> local_189;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_188;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_180;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_178;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_170;
  Data local_168;
  allocator<unsigned_char> local_149;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_148;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_140;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_138;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_130;
  Data local_128;
  int local_10c;
  undefined1 local_108 [4];
  int crc_block_size;
  Data data;
  Sector *s;
  const_iterator __end1;
  const_iterator __begin1;
  Track *__range1;
  undefined1 local_c8 [4];
  int sector_index;
  BitstreamTrackBuilder bitbuf;
  allocator<unsigned_char> local_36;
  uchar local_35 [5];
  iterator local_30;
  size_type local_28;
  Track *local_20;
  Track *track_local;
  CylHead *cylhead_local;
  
  local_20 = track;
  track_local = (Track *)cylhead;
  cylhead_local = &__return_storage_ptr__->cylhead;
  bVar3 = IsKBI19Track(track);
  if (bVar3) {
    if ((GenerateKBI19Track(CylHead_const&,Track_const&)::gap2_sig == '\0') &&
       (iVar4 = __cxa_guard_acquire(&GenerateKBI19Track(CylHead_const&,Track_const&)::gap2_sig),
       iVar4 != 0)) {
      builtin_memcpy(local_35," KBI ",5);
      local_30 = local_35;
      local_28 = 5;
      std::allocator<unsigned_char>::allocator(&local_36);
      iVar1._M_len = local_28;
      iVar1._M_array = local_30;
      Data::vector(&GenerateKBI19Track::gap2_sig,iVar1,&local_36);
      std::allocator<unsigned_char>::~allocator(&local_36);
      __cxa_atexit(Data::~Data,&GenerateKBI19Track::gap2_sig,&__dso_handle);
      __cxa_guard_release(&GenerateKBI19Track(CylHead_const&,Track_const&)::gap2_sig);
    }
    BitstreamTrackBuilder::BitstreamTrackBuilder((BitstreamTrackBuilder *)local_c8,_250K,MFM);
    TrackBuilder::addGap((TrackBuilder *)local_c8,0x40,-1);
    TrackBuilder::addIAM((TrackBuilder *)local_c8);
    TrackBuilder::addGap((TrackBuilder *)local_c8,0x32,-1);
    pTVar2 = local_20;
    __range1._4_4_ = 0;
    __end1 = Track::begin(local_20);
    s = (Sector *)Track::end(pTVar2);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>
                                       *)&s), bVar3) {
      data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>
                    ::operator*(&__end1);
      TrackBuilder::addSectorHeader
                ((TrackBuilder *)local_c8,
                 (Header *)
                 data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,false);
      if (*(int *)(data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 8) == 0) {
        TrackBuilder::addGap((TrackBuilder *)local_c8,0x11,-1);
        TrackBuilder::addBlock((TrackBuilder *)local_c8,&GenerateKBI19Track::gap2_sig);
      }
      else {
        TrackBuilder::addGap((TrackBuilder *)local_c8,8,-1);
        TrackBuilder::addBlock((TrackBuilder *)local_c8,&GenerateKBI19Track::gap2_sig);
        TrackBuilder::addGap((TrackBuilder *)local_c8,9,-1);
      }
      TrackBuilder::addAM((TrackBuilder *)local_c8,
                          (uint)data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage[0x20],false);
      pDVar5 = Sector::data_copy((Sector *)
                                 data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,0);
      Data::Data((Data *)local_108,pDVar5);
      if (__range1._4_4_ % 3 == 0) {
        if (*(int *)(data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 8) == 0) {
          iVar4 = Sector::size((Sector *)
                               data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108,(long)iVar4)
          ;
          TrackBuilder::addBlock((TrackBuilder *)local_c8,(Data *)local_108);
          BitstreamTrackBuilder::addCrc((BitstreamTrackBuilder *)local_c8,0x204);
        }
        else {
          local_10c = Sector::size((Sector *)
                                   data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_10c = local_10c + 4;
          local_138._M_current =
               (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_108);
          local_130 = __gnu_cxx::
                      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+(&local_138,0);
          local_148._M_current =
               (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_108);
          local_140 = __gnu_cxx::
                      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+(&local_148,0x10e);
          std::allocator<unsigned_char>::allocator(&local_149);
          Data::
          vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                    (&local_128,local_130,local_140,&local_149);
          TrackBuilder::addBlock((TrackBuilder *)local_c8,&local_128);
          Data::~Data(&local_128);
          std::allocator<unsigned_char>::~allocator(&local_149);
          BitstreamTrackBuilder::addCrc((BitstreamTrackBuilder *)local_c8,local_10c);
          local_178._M_current =
               (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_108);
          local_170 = __gnu_cxx::
                      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+(&local_178,0x110);
          local_188._M_current =
               (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_108);
          local_180 = __gnu_cxx::
                      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+(&local_188,0x187);
          std::allocator<unsigned_char>::allocator(&local_189);
          Data::
          vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                    (&local_168,local_170,local_180,&local_189);
          TrackBuilder::addBlock((TrackBuilder *)local_c8,&local_168);
          Data::~Data(&local_168);
          std::allocator<unsigned_char>::~allocator(&local_189);
          BitstreamTrackBuilder::addCrc((BitstreamTrackBuilder *)local_c8,local_10c);
          local_1b8._M_current =
               (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_108);
          local_1b0 = __gnu_cxx::
                      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+(&local_1b8,0x189);
          local_1c8._M_current =
               (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_108);
          iVar4 = Sector::size((Sector *)
                               data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
          local_1c0 = __gnu_cxx::
                      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+(&local_1c8,(long)iVar4);
          std::allocator<unsigned_char>::allocator(&local_1c9);
          Data::
          vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                    (&local_1a8,local_1b0,local_1c0,&local_1c9);
          TrackBuilder::addBlock((TrackBuilder *)local_c8,&local_1a8);
          Data::~Data(&local_1a8);
          std::allocator<unsigned_char>::~allocator(&local_1c9);
          BitstreamTrackBuilder::addCrc((BitstreamTrackBuilder *)local_c8,local_10c);
          TrackBuilder::addGap((TrackBuilder *)local_c8,0x50,-1);
        }
      }
      else {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108,0x3d);
        TrackBuilder::addBlock((TrackBuilder *)local_c8,(Data *)local_108);
      }
      Data::~Data((Data *)local_108);
      __gnu_cxx::__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
      operator++(&__end1);
      __range1._4_4_ = __range1._4_4_ + 1;
    }
    TrackBuilder::addGap((TrackBuilder *)local_c8,0x5a,-1);
    pTVar2 = track_local;
    bitstream = BitstreamTrackBuilder::buffer((BitstreamTrackBuilder *)local_c8);
    TrackData::TrackData(__return_storage_ptr__,(CylHead *)pTVar2,bitstream);
    BitstreamTrackBuilder::~BitstreamTrackBuilder((BitstreamTrackBuilder *)local_c8);
    return __return_storage_ptr__;
  }
  __assert_fail("IsKBI19Track(track)",
                "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/SpecialFormat.cpp"
                ,0x3a,"TrackData GenerateKBI19Track(const CylHead &, const Track &)");
}

Assistant:

TrackData GenerateKBI19Track(const CylHead& cylhead, const Track& track)
{
    assert(IsKBI19Track(track));

    static const Data gap2_sig{ 0x20,0x4B,0x42,0x49,0x20 }; // " KBI "
    BitstreamTrackBuilder bitbuf(DataRate::_250K, Encoding::MFM);

    // Track start with slightly shorter gap4a.
    bitbuf.addGap(64);
    bitbuf.addIAM();
    bitbuf.addGap(50);

    int sector_index = 0;
    for (auto& s : track)
    {
        bitbuf.addSectorHeader(s.header);

        if (s.header.sector == 0)
        {
            bitbuf.addGap(17);
            bitbuf.addBlock(gap2_sig);
        }
        else
        {
            bitbuf.addGap(8);
            bitbuf.addBlock(gap2_sig);
            bitbuf.addGap(9);
        }

        bitbuf.addAM(s.dam);
        auto data = s.data_copy();

        // Short or full sector data?
        if (sector_index++ % 3)
        {
            data.resize(61);
            bitbuf.addBlock(data);
        }
        else
        {
            if (s.header.sector == 0)
            {
                data.resize(s.size());
                bitbuf.addBlock(data);
                bitbuf.addCrc(3 + 1 + 512);
            }
            else
            {
                auto crc_block_size = 3 + 1 + s.size();
                bitbuf.addBlock({ data.begin() + 0, data.begin() + 0x10e });
                bitbuf.addCrc(crc_block_size);
                bitbuf.addBlock({ data.begin() + 0x110, data.begin() + 0x187 });
                bitbuf.addCrc(crc_block_size);
                bitbuf.addBlock({ data.begin() + 0x189, data.begin() + s.size() });
                bitbuf.addCrc(crc_block_size);
                bitbuf.addGap(80);
            }
        }
    }

    // Pad up to normal track size.
    bitbuf.addGap(90);

    return TrackData(cylhead, std::move(bitbuf.buffer()));
}